

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::AnimatedPrimitive::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,AnimatedPrimitive *this,Ray *r,
          Float tMax)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  anon_struct_8_0_00000001_for___align aVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int vb;
  Float tMax_local;
  optional<pbrt::ShapeIntersection> si;
  type va;
  Float FStack_1cc;
  Interval IStack_1c8;
  Interval IStack_1c0;
  Float FStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  Tuple3<pbrt::Normal3,_float> aTStack_1a8 [2];
  MediumInterface *local_190;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_188;
  Tuple3<pbrt::Vector3,_float> local_180 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_168 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_150 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_138 [2];
  Tuple3<pbrt::Normal3,_float> TStack_120;
  int iStack_114;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_110;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_108;
  Tuple3<pbrt::Vector3,_float> local_100 [3];
  Float FStack_dc;
  Ray ray;
  Transform interpRenderFromPrimitive;
  
  tMax_local = tMax;
  AnimatedTransform::Interpolate(&interpRenderFromPrimitive,&this->renderFromPrimitive,r->time);
  Transform::ApplyInverse(&ray,&interpRenderFromPrimitive,r,&tMax_local);
  PrimitiveHandle::Intersect(&si,&this->primitive,&ray,tMax_local);
  if (si.set == false) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    Transform::operator()
              ((SurfaceInteraction *)&va,&interpRenderFromPrimitive,(SurfaceInteraction *)&si);
    if (si.set == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
    }
    si.optionalValue._64_8_ = local_190;
    aVar3._4_4_ = FStack_1cc;
    aVar3._0_4_ = va;
    si.optionalValue._8_4_ = IStack_1c8.low;
    si.optionalValue._12_4_ = IStack_1c8.high;
    si.optionalValue._16_4_ = IStack_1c0.low;
    si.optionalValue._20_4_ = IStack_1c0.high;
    si.optionalValue._24_4_ = FStack_1b8;
    si.optionalValue._28_4_ = fStack_1b4;
    si.optionalValue._32_4_ = fStack_1b0;
    si.optionalValue._36_4_ = fStack_1ac;
    si.optionalValue._40_4_ = aTStack_1a8[0].x;
    si.optionalValue._44_4_ = aTStack_1a8[0].y;
    uVar4 = si.optionalValue._40_8_;
    si.optionalValue._48_4_ = aTStack_1a8[0].z;
    si.optionalValue._52_4_ = aTStack_1a8[1].x;
    uVar5 = si.optionalValue._48_8_;
    si.optionalValue._56_4_ = aTStack_1a8[1].y;
    si.optionalValue._60_4_ = aTStack_1a8[1].z;
    si.optionalValue._72_8_ = local_188.bits;
    si.optionalValue._80_4_ = local_180[0].x;
    si.optionalValue._84_4_ = local_180[0].y;
    si.optionalValue._88_4_ = local_180[0].z;
    si.optionalValue._92_4_ = local_180[1].x;
    si.optionalValue._96_4_ = local_180[1].y;
    si.optionalValue._100_4_ = local_180[1].z;
    si.optionalValue._104_4_ = aTStack_168[0].x;
    si.optionalValue._108_4_ = aTStack_168[0].y;
    si.optionalValue._112_4_ = aTStack_168[0].z;
    si.optionalValue._116_4_ = aTStack_168[1].x;
    si.optionalValue._120_4_ = aTStack_168[1].y;
    si.optionalValue._124_4_ = aTStack_168[1].z;
    si.optionalValue._128_4_ = aTStack_150[0].x;
    si.optionalValue._132_4_ = aTStack_150[0].y;
    uVar6 = si.optionalValue._128_8_;
    si.optionalValue._136_4_ = aTStack_150[0].z;
    si.optionalValue._140_4_ = aTStack_150[1].x;
    uVar7 = si.optionalValue._136_8_;
    si.optionalValue._144_4_ = aTStack_150[1].y;
    si.optionalValue._148_4_ = aTStack_150[1].z;
    si.optionalValue._152_4_ = aTStack_138[0].x;
    si.optionalValue._156_4_ = aTStack_138[0].y;
    si.optionalValue._160_4_ = aTStack_138[0].z;
    si.optionalValue._164_4_ = aTStack_138[1].x;
    si.optionalValue._168_4_ = aTStack_138[1].y;
    si.optionalValue._172_4_ = aTStack_138[1].z;
    si.optionalValue._176_4_ = TStack_120.x;
    si.optionalValue._180_4_ = TStack_120.y;
    si.optionalValue._184_4_ = TStack_120.z;
    si.optionalValue._188_4_ = iStack_114;
    si.optionalValue._192_8_ = local_110.bits;
    si.optionalValue._200_8_ = local_108.bits;
    si.optionalValue._208_4_ = local_100[0].x;
    si.optionalValue._212_4_ = local_100[0].y;
    si.optionalValue._216_4_ = local_100[0].z;
    si.optionalValue._220_4_ = local_100[1].x;
    si.optionalValue._224_4_ = local_100[1].y;
    si.optionalValue._228_4_ = local_100[1].z;
    si.optionalValue._232_4_ = local_100[2].x;
    si.optionalValue._236_4_ = local_100[2].y;
    si.optionalValue._240_4_ = local_100[2].z;
    si.optionalValue._244_4_ = FStack_dc;
    si.optionalValue._40_4_ = (undefined4)aTStack_1a8[0]._0_8_;
    si.optionalValue._44_4_ = SUB84(aTStack_1a8[0]._0_8_,4);
    si.optionalValue._48_4_ = (undefined4)aTStack_1a8._8_8_;
    si.optionalValue._136_4_ = (undefined4)aTStack_150._8_8_;
    si.optionalValue._132_4_ = SUB84(aTStack_150[0]._0_8_,4);
    auVar1 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._44_4_),
                             ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                           (float)si.optionalValue._136_4_)),
                             ZEXT416((uint)si.optionalValue._132_4_));
    auVar2 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._136_4_),
                             ZEXT416((uint)si.optionalValue._48_4_),
                             ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                           (float)si.optionalValue._136_4_)));
    si.optionalValue._128_4_ = (undefined4)aTStack_150[0]._0_8_;
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ + auVar2._0_4_)),
                             ZEXT416((uint)si.optionalValue._40_4_),
                             ZEXT416((uint)si.optionalValue._128_4_));
    va = auVar1._0_4_;
    vb = 0;
    if (va < 0.0) {
      si.optionalValue._40_8_ = uVar4;
      si.optionalValue._48_8_ = uVar5;
      si.optionalValue._128_8_ = uVar6;
      si.optionalValue._136_8_ = uVar7;
      LogFatal<char_const(&)[36],char_const(&)[2],char_const(&)[36],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/primitive.cpp"
                 ,0xa0,"Check failed: %s >= %s with %s = %s, %s = %s",
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(char (*) [2])0x5859ee,
                 (char (*) [36])"Dot(si->intr.n, si->intr.shading.n)",(float *)&va,
                 (char (*) [2])0x5859ee,&vb);
    }
    __return_storage_ptr__->set = si.set;
    (__return_storage_ptr__->optionalValue).__align = aVar3;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) = IStack_1c8;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) = IStack_1c0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = _FStack_1b8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = _fStack_1b0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = aTStack_1a8[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = aTStack_1a8._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = aTStack_1a8[1]._4_8_;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_190;
    ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      *)((long)&__return_storage_ptr__->optionalValue + 0x48))->bits = local_188.bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_180[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_180._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_180[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = aTStack_168[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = aTStack_168._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = aTStack_168[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = aTStack_150[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = aTStack_150._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = aTStack_150[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = aTStack_150._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = aTStack_150[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = aTStack_138[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = aTStack_138._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = aTStack_138[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = TStack_120._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = stack0xfffffffffffffee8;
    ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      *)((long)&__return_storage_ptr__->optionalValue + 0xc0))->bits = local_110.bits;
    ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      *)((long)&__return_storage_ptr__->optionalValue + 200))->bits = local_108.bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = local_100[0]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_100._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = local_100[1]._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_100[2]._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = stack0xffffffffffffff20;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = si.optionalValue._248_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> AnimatedPrimitive::Intersect(const Ray &r,
                                                               Float tMax) const {
    // Compute _ray_ after transformation by _renderFromPrimitive_
    Transform interpRenderFromPrimitive = renderFromPrimitive.Interpolate(r.time);
    Ray ray = interpRenderFromPrimitive.ApplyInverse(r, &tMax);
    pstd::optional<ShapeIntersection> si = primitive.Intersect(ray, tMax);
    if (!si)
        return {};

    // Transform instance's intersection data to rendering space
    si->intr = interpRenderFromPrimitive(si->intr);
    CHECK_GE(Dot(si->intr.n, si->intr.shading.n), 0);
    return si;
}